

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O3

void deqp::egl::createQueryContextGroups<deqp::egl::GetCurrentSurfaceCase>
               (EglTestContext *eglTestCtx,TestCaseGroup *group)

{
  GetCurrentSurfaceCase *this;
  pointer filters;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> local_68;
  FilterList local_48;
  
  local_68.
  super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  getDefaultRenderFilterLists(&local_68,&local_48);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  filters = local_68.
            super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this = (GetCurrentSurfaceCase *)operator_new(0xd8);
      GetCurrentSurfaceCase::GetCurrentSurfaceCase
                (this,eglTestCtx,(filters->super_NamedFilterList).m_name._M_dataplus._M_p,"",
                 (FilterList *)filters,filters->m_surfaceTypeMask);
      tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
      filters = filters + 1;
    } while (filters !=
             local_68.
             super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::~vector
            (&local_68);
  return;
}

Assistant:

void createQueryContextGroups (EglTestContext& eglTestCtx, tcu::TestCaseGroup* group)
{
	std::vector<RenderFilterList> filterLists;

	getDefaultRenderFilterLists(filterLists, eglu::FilterList());

	for (std::vector<RenderFilterList>::const_iterator listIter = filterLists.begin(); listIter != filterLists.end(); listIter++)
		group->addChild(new QueryContextClass(eglTestCtx, listIter->getName(), "", *listIter, listIter->getSurfaceTypeMask()));
}